

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_9054fc::cmBlockFunctionBlocker::~cmBlockFunctionBlocker
          (cmBlockFunctionBlocker *this)

{
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR__cmBlockFunctionBlocker_009a1b18;
  if (((this->Scopes).Set.super__Base_bitset<1UL>._M_w & 1) != 0) {
    cmMakefile::RaiseScope(this->Makefile,&this->VariableNames);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->VariableNames);
  std::unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>::
  ~unique_ptr(&(this->BlockScope).VariableScope);
  std::unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>::
  ~unique_ptr(&(this->BlockScope).PolicyScope);
  cmFunctionBlocker::~cmFunctionBlocker(&this->super_cmFunctionBlocker);
  return;
}

Assistant:

cmBlockFunctionBlocker::~cmBlockFunctionBlocker()
{
  if (this->Scopes.contains(ScopeType::VARIABLES)) {
    this->Makefile->RaiseScope(this->VariableNames);
  }
}